

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.cc
# Opt level: O2

void __thiscall
google::protobuf::DescriptorBuilder::ValidateMessageOptions
          (DescriptorBuilder *this,Descriptor *message,DescriptorProto *proto)

{
  RepeatedPtrField<google::protobuf::DescriptorProto> *this_00;
  RepeatedPtrField<google::protobuf::EnumDescriptorProto> *this_01;
  RepeatedPtrField<google::protobuf::FieldDescriptorProto> *this_02;
  long lVar1;
  Type *pTVar2;
  Type *proto_00;
  Type *proto_01;
  long lVar3;
  int i;
  long lVar4;
  allocator local_289;
  DescriptorProto *local_288;
  DescriptorBuilder *local_280;
  long local_278;
  Type *local_270;
  long local_268;
  long local_260;
  long local_258;
  string local_250;
  SubstituteArg local_230;
  SubstituteArg local_200;
  SubstituteArg local_1d0;
  SubstituteArg local_1a0;
  SubstituteArg local_170;
  SubstituteArg local_140;
  SubstituteArg local_110;
  SubstituteArg local_e0;
  SubstituteArg local_b0;
  string local_80;
  SubstituteArg local_60;
  
  lVar3 = 0;
  local_288 = proto;
  for (lVar4 = 0; lVar4 < *(int *)(message + 4); lVar4 = lVar4 + 1) {
    lVar1 = *(long *)(message + 0x28);
    pTVar2 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&(proto->field_).super_RepeatedPtrFieldBase,(int)lVar4);
    ValidateFieldOptions(this,(FieldDescriptor *)(lVar1 + lVar3),pTVar2);
    lVar3 = lVar3 + 0x48;
  }
  this_00 = &local_288->nested_type_;
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(message + 0x70); lVar4 = lVar4 + 1) {
    lVar1 = *(long *)(message + 0x38);
    proto_00 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto>::TypeHandler>
                         (&this_00->super_RepeatedPtrFieldBase,(int)lVar4);
    ValidateMessageOptions(this,(Descriptor *)(lVar1 + lVar3),proto_00);
    lVar3 = lVar3 + 0x88;
  }
  this_01 = &local_288->enum_type_;
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(message + 0x74); lVar4 = lVar4 + 1) {
    lVar1 = *(long *)(message + 0x40);
    proto_01 = internal::RepeatedPtrFieldBase::
               Get<google::protobuf::RepeatedPtrField<google::protobuf::EnumDescriptorProto>::TypeHandler>
                         (&this_01->super_RepeatedPtrFieldBase,(int)lVar4);
    ValidateEnumOptions(this,(EnumDescriptor *)(lVar1 + lVar3),proto_01);
    lVar3 = lVar3 + 0x48;
  }
  this_02 = &local_288->extension_;
  lVar3 = 0;
  for (lVar4 = 0; lVar4 < *(int *)(message + 0x7c); lVar4 = lVar4 + 1) {
    lVar1 = *(long *)(message + 0x50);
    pTVar2 = internal::RepeatedPtrFieldBase::
             Get<google::protobuf::RepeatedPtrField<google::protobuf::FieldDescriptorProto>::TypeHandler>
                       (&this_02->super_RepeatedPtrFieldBase,(int)lVar4);
    ValidateFieldOptions(this,(FieldDescriptor *)(lVar1 + lVar3),pTVar2);
    lVar3 = lVar3 + 0x48;
  }
  local_278 = 0x1fffffff;
  if (*(char *)(*(long *)(message + 0x20) + 0x48) != '\0') {
    local_278 = 0x7fffffff;
  }
  local_260 = local_278 + 1;
  local_288 = (DescriptorProto *)&local_288->extension_range_;
  local_258 = 4;
  local_280 = this;
  for (lVar3 = 0; lVar3 < *(int *)(message + 0x78); lVar3 = lVar3 + 1) {
    if (local_260 < *(int *)(*(long *)(message + 0x48) + local_258)) {
      lVar4 = *(long *)(message + 8);
      local_268 = lVar3;
      local_270 = internal::RepeatedPtrFieldBase::
                  Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
                            ((RepeatedPtrFieldBase *)local_288,(int)lVar3);
      std::__cxx11::string::string
                ((string *)&local_250,"Extension numbers cannot be greater than $0.",&local_289);
      strings::internal::SubstituteArg::SubstituteArg(&local_60,local_278);
      local_b0.text_ = (char *)0x0;
      local_b0.size_ = -1;
      local_e0.text_ = (char *)0x0;
      local_e0.size_ = -1;
      local_110.text_ = (char *)0x0;
      local_110.size_ = -1;
      local_140.text_ = (char *)0x0;
      local_140.size_ = -1;
      local_170.text_ = (char *)0x0;
      local_170.size_ = -1;
      local_1a0.text_ = (char *)0x0;
      local_1a0.size_ = -1;
      local_1d0.text_ = (char *)0x0;
      local_1d0.size_ = -1;
      local_200.text_ = (char *)0x0;
      local_200.size_ = -1;
      local_230.text_ = (char *)0x0;
      local_230.size_ = -1;
      strings::Substitute(&local_80,&local_250,&local_60,&local_b0,&local_e0,&local_110,&local_140,
                          &local_170,&local_1a0,&local_1d0,&local_200,&local_230);
      AddError(local_280,(string *)(lVar4 + 0x20),&local_270->super_Message,NUMBER,&local_80);
      lVar3 = local_268;
      std::__cxx11::string::~string((string *)&local_80);
      std::__cxx11::string::~string((string *)&local_250);
    }
    internal::RepeatedPtrFieldBase::
    Get<google::protobuf::RepeatedPtrField<google::protobuf::DescriptorProto_ExtensionRange>::TypeHandler>
              ((RepeatedPtrFieldBase *)local_288,(int)lVar3);
    local_258 = local_258 + 0x10;
  }
  return;
}

Assistant:

void DescriptorBuilder::ValidateMessageOptions(Descriptor* message,
                                               const DescriptorProto& proto) {
  VALIDATE_OPTIONS_FROM_ARRAY(message, field, Field);
  VALIDATE_OPTIONS_FROM_ARRAY(message, nested_type, Message);
  VALIDATE_OPTIONS_FROM_ARRAY(message, enum_type, Enum);
  VALIDATE_OPTIONS_FROM_ARRAY(message, extension, Field);

  const int64_t max_extension_range =
      static_cast<int64_t>(message->options().message_set_wire_format()
                               ? std::numeric_limits<int32_t>::max()
                               : FieldDescriptor::kMaxNumber);
  for (int i = 0; i < message->extension_range_count(); ++i) {
    if (message->extension_range(i)->end > max_extension_range + 1) {
      AddError(message->full_name(), proto.extension_range(i),
               DescriptorPool::ErrorCollector::NUMBER,
               strings::Substitute("Extension numbers cannot be greater than $0.",
                                max_extension_range));
    }

    ValidateExtensionRangeOptions(message->full_name(),
                                  message->extension_ranges_ + i,
                                  proto.extension_range(i));
  }
}